

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
sort_fn<std::greater<void>>::operator()
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          sort_fn<std::greater<void>> *this,vector<int,_std::allocator<int>_> *c)

{
  iterator iVar1;
  iterator iVar2;
  vector<int,_std::allocator<int>_> *c_local;
  sort_fn<std::greater<void>_> *this_local;
  
  iVar1 = std::vector<int,_std::allocator<int>_>::begin(c);
  iVar2 = std::vector<int,_std::allocator<int>_>::end(c);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<void>>
            (iVar1._M_current,iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end(), compare);
        return c;
    }